

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O3

void RigidBodyDynamics::InverseDynamicsConstraintsRelaxed
               (Model *model,VectorNd *Q,VectorNd *QDot,VectorNd *QDDotControls,ConstraintSet *CS,
               VectorNd *QDDotOutput,VectorNd *TauOutput,bool update_kinematics,
               vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *f_ext)

{
  ConstraintSet *pCVar1;
  ConstraintSet *pCVar2;
  HouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this;
  double **ppdVar3;
  double *pdVar4;
  double *pdVar5;
  Index IVar6;
  double dVar7;
  undefined1 auVar8 [8];
  ActualDstType actualDst;
  LhsNested pMVar9;
  undefined8 *puVar10;
  RhsNested pMVar11;
  RhsNested pMVar12;
  ConstraintSet *pCVar13;
  RhsNested pMVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  ConstraintSet *pCVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  ActualDstType actualDst_6;
  RhsNested pMVar22;
  ActualDstType actualDst_1;
  non_const_type pMVar23;
  ActualDstType actualDst_5;
  ActualDstType actualDst_2;
  ActualDstType actualDst_3;
  type tmp;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_158;
  ConstraintSet *local_130;
  ConstraintSet *local_128;
  ConstraintSet *local_120;
  ConstraintSet *local_118;
  ConstraintSet *local_110;
  ConstraintSet *local_108;
  ConstraintSet *local_100;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_f8;
  undefined1 local_e0 [8];
  undefined1 local_d8 [48];
  RhsNested local_a8;
  ConstraintSet *local_a0;
  ConstraintSet *local_98;
  ConstraintSet *local_88;
  ConstraintSet *local_80;
  ConstraintSet *local_78;
  ConstraintSet *local_70;
  ConstraintSet *local_68;
  RhsNested local_60;
  RhsNested local_58;
  ConstraintSet *local_50;
  ulong local_48;
  ConstraintSet *local_40;
  Scalar local_38;
  
  lVar16 = (TauOutput->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_rows;
  local_60 = (RhsNested)QDDotControls;
  local_58 = (RhsNested)QDDotOutput;
  if (0 < lVar16) {
    memset((TauOutput->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data,0,lVar16 << 3);
  }
  CalcConstrainedSystemVariables(model,Q,QDot,QDDotControls,CS,update_kinematics,f_ext);
  pCVar1 = CS + 0x160;
  local_48 = *(ulong *)(CS + 0x168);
  local_108 = (ConstraintSet *)(*(long *)(CS + 0x28) - *(long *)(CS + 0x20) >> 5);
  pCVar2 = CS + 0x1e8;
  local_d8._0_8_ = *(undefined8 *)(CS + 0x1f0);
  local_d8._8_8_ = *(undefined8 *)(CS + 0x1f8);
  local_120 = *(ConstraintSet **)(CS + 0x1f0);
  local_128 = (ConstraintSet *)(ulong)(uint)((int)local_48 - (int)local_120);
  local_d8._16_8_ = 100.0;
  pCVar18 = CS + 0x218;
  local_d8._24_8_ = pCVar2;
  local_d8._40_8_ = pCVar1;
  local_a8.m_matrix = (non_const_type)pCVar2;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)pCVar18,
             (Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
              *)local_e0,(assign_op<double,_double> *)&local_158,(type)0x0);
  local_e0 = (undefined1  [8])pCVar18;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Inverse<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<double,__1,__1,_0,__1,__1> *)(CS + 0x230),(SrcXprType *)local_e0,
        (assign_op<double,_double> *)&local_158);
  local_d8._8_8_ = CS + 0x178;
  local_70 = CS + 0x248;
  local_e0 = (undefined1  [8])(CS + 0x230);
  local_d8._0_8_ = pCVar2;
  local_40 = (ConstraintSet *)local_d8._8_8_;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Matrix<double,_1,1,0,_1,1>,0>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_70,
             (Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
              *)local_e0,(assign_op<double,_double> *)&local_158,(type)0x0);
  local_100 = CS + 0x278;
  pMVar22 = (RhsNested)((ulong)local_120 & 0xffffffff);
  local_e0 = *(undefined1 (*) [8])(CS + 0x278);
  local_d8._40_8_ = *(undefined8 *)(CS + 0x280);
  local_d8._24_8_ = (RhsNested)0x0;
  local_d8._32_8_ = (non_const_type)0x0;
  local_158.m_lhs.m_lhs.m_lhs = (LhsNested)pCVar2;
  local_158.m_lhs.m_lhs.m_rhs = (RhsNested)pCVar1;
  local_158.m_lhs.m_rhs.m_matrix = (non_const_type)pCVar2;
  local_158.m_rhs = (RhsNested)pCVar18;
  local_130 = pCVar1;
  local_110 = pCVar2;
  local_d8._0_8_ = pMVar22;
  local_d8._8_8_ = pMVar22;
  local_d8._16_8_ = local_100;
  local_68 = pCVar18;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::internal::assign_op<double,double>>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_e0,&local_158,
             (assign_op<double,_double> *)&local_88);
  pCVar13 = local_128;
  pCVar18 = CS + 0x200;
  local_d8._40_8_ = *(undefined8 *)(CS + 0x280);
  local_e0 = (undefined1  [8])(local_d8._40_8_ * (long)pMVar22 * 8 + *(long *)(CS + 0x278));
  local_d8._8_8_ = local_128;
  local_d8._16_8_ = local_100;
  local_d8._24_8_ = (RhsNested)0x0;
  local_158.m_lhs.m_lhs.m_lhs = (LhsNested)pCVar2;
  local_158.m_lhs.m_lhs.m_rhs = (RhsNested)pCVar1;
  local_158.m_lhs.m_rhs.m_matrix = (non_const_type)pCVar18;
  local_120 = pCVar18;
  local_d8._0_8_ = pMVar22;
  local_d8._32_8_ = pMVar22;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>,Eigen::internal::assign_op<double,double>>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_e0,
             &local_158.m_lhs,(assign_op<double,_double> *)&local_88,(type)0x0);
  pCVar1 = local_100;
  local_158.m_lhs.m_lhs.m_rhs = (RhsNested)local_130;
  local_158.m_lhs.m_rhs.m_matrix = (non_const_type)local_110;
  lVar16 = (long)pMVar22 * 8;
  local_e0 = (undefined1  [8])(*(long *)(CS + 0x278) + lVar16);
  local_d8._40_8_ = *(undefined8 *)(CS + 0x280);
  local_d8._0_8_ = pCVar13;
  local_d8._16_8_ = local_100;
  local_d8._32_8_ = (non_const_type)0x0;
  local_158.m_lhs.m_lhs.m_lhs = (LhsNested)pCVar18;
  local_118 = (ConstraintSet *)lVar16;
  local_d8._8_8_ = pMVar22;
  local_d8._24_8_ = pMVar22;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>,Eigen::internal::assign_op<double,double>>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_e0,
             &local_158.m_lhs,(assign_op<double,_double> *)&local_88,(type)0x0);
  local_158.m_lhs.m_lhs.m_lhs = (LhsNested)local_120;
  local_158.m_lhs.m_lhs.m_rhs = (RhsNested)local_130;
  local_158.m_lhs.m_rhs.m_matrix = (non_const_type)local_120;
  local_d8._40_8_ = *(undefined8 *)(CS + 0x280);
  local_e0 = (undefined1  [8])(*(long *)(CS + 0x278) + lVar16 + local_d8._40_8_ * (long)pMVar22 * 8)
  ;
  local_d8._0_8_ = local_128;
  local_d8._8_8_ = local_128;
  local_d8._16_8_ = pCVar1;
  local_d8._24_8_ = pMVar22;
  local_d8._32_8_ = pMVar22;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>,Eigen::internal::assign_op<double,double>>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_e0,
             &local_158.m_lhs,(assign_op<double,_double> *)&local_88,(type)0x0);
  local_158.m_lhs.m_lhs.m_lhs = (LhsNested)local_110;
  local_130 = CS + 0x2f0;
  pMVar23 = (non_const_type)((ulong)local_108 & 0xffffffff);
  local_e0 = *(undefined1 (*) [8])(CS + 0x2f0);
  local_d8._40_8_ = *(undefined8 *)(CS + 0x2f8);
  local_d8._24_8_ = (RhsNested)0x0;
  local_d8._32_8_ = (non_const_type)0x0;
  local_158.m_lhs.m_lhs.m_rhs = (RhsNested)(CS + 0x198);
  local_d8._0_8_ = pMVar22;
  local_d8._8_8_ = pMVar23;
  local_d8._16_8_ = local_130;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>,Eigen::internal::assign_op<double,double>>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_e0,
             (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
              *)&local_158,(assign_op<double,_double> *)&local_88,(type)0x0);
  pCVar1 = local_130;
  local_158.m_lhs.m_lhs.m_lhs = (LhsNested)local_120;
  local_e0 = (undefined1  [8])((long)local_118 + *(long *)(CS + 0x2f0));
  local_d8._40_8_ = *(undefined8 *)(CS + 0x2f8);
  local_d8._0_8_ = local_128;
  local_d8._16_8_ = local_130;
  local_d8._32_8_ = (non_const_type)0x0;
  local_158.m_lhs.m_lhs.m_rhs = (RhsNested)(CS + 0x198);
  local_118 = (ConstraintSet *)pMVar23;
  local_d8._8_8_ = pMVar23;
  local_d8._24_8_ = pMVar22;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>,Eigen::internal::assign_op<double,double>>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_e0,
             (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
              *)&local_158,(assign_op<double,_double> *)&local_88,(type)0x0);
  this = (HouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)(CS + 0x380);
  Eigen::HouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  compute<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (this,(EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pCVar1);
  local_d8._0_8_ = CS + 0x398;
  local_d8._8_8_ = local_d8._8_8_ & 0xffffffffffffff00;
  pMVar11 = *(RhsNested *)(CS + 0x388);
  local_d8._16_8_ = *(RhsNested *)(CS + 0x390);
  if ((long)pMVar11 <= (long)*(RhsNested *)(CS + 0x390)) {
    local_d8._16_8_ = pMVar11;
  }
  local_d8._24_8_ = (RhsNested)0x0;
  local_158.m_lhs.m_lhs.m_lhs = (LhsNested)0x0;
  pMVar9 = local_158.m_lhs.m_lhs.m_lhs;
  local_e0 = (undefined1  [8])this;
  if (pMVar11 != (RhsNested)0x0) {
    if ((long)pMVar11 < 1) {
      pMVar9 = (LhsNested)0x0;
    }
    else if (((ulong)pMVar11 >> 0x3d != 0) ||
            (pMVar9 = (LhsNested)malloc((long)pMVar11 * 8), pMVar9 == (LhsNested)0x0)) {
      puVar10 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar10 = operator_new;
      __cxa_throw(puVar10,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  local_158.m_lhs.m_lhs.m_lhs = pMVar9;
  pCVar2 = CS + 0x458;
  local_158.m_lhs.m_lhs.m_rhs = pMVar11;
  Eigen::
  HouseholderSequence<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,1>::
  evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>>
            ((HouseholderSequence<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,1>
              *)local_e0,(Matrix<double,__1,__1,_0,__1,__1> *)pCVar2,
             (Matrix<double,__1,_1,_0,__1,_1> *)&local_158);
  free(local_158.m_lhs.m_lhs.m_lhs);
  local_d8._0_8_ = pCVar1;
  local_e0 = (undefined1  [8])pCVar2;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)(CS + 0x4b8),
             (Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
              *)local_e0,(assign_op<double,_double> *)&local_158,(type)0x0);
  pCVar1 = local_118;
  local_e0 = *(undefined1 (*) [8])(CS + 0x4b8);
  local_d8._40_8_ = *(undefined8 *)(CS + 0x4c0);
  local_d8._0_8_ = local_118;
  local_d8._8_8_ = local_118;
  local_d8._24_8_ = (RhsNested)0x0;
  local_d8._32_8_ = (non_const_type)0x0;
  local_130 = CS + 0x348;
  local_d8._16_8_ = CS + 0x4b8;
  local_50 = pCVar2;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)local_130,
             (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_e0,
             (assign_op<double,_double> *)&local_158);
  pCVar2 = local_50;
  iVar21 = (int)local_48;
  uVar17 = local_48 & 0xffffffff;
  local_e0 = *(undefined1 (*) [8])(CS + 0x458);
  local_d8._40_8_ = *(undefined8 *)(CS + 0x460);
  local_d8._8_8_ = pCVar1;
  local_d8._16_8_ = local_50;
  local_d8._24_8_ = (RhsNested)0x0;
  local_d8._32_8_ = (non_const_type)0x0;
  local_128 = CS + 0x488;
  local_d8._0_8_ = uVar17;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)local_128,
             (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_e0,
             (assign_op<double,_double> *)&local_158);
  local_d8._8_8_ = ZEXT48((uint)(iVar21 - (int)local_108));
  local_d8._40_8_ = *(undefined8 *)(CS + 0x460);
  local_e0 = (undefined1  [8])(local_d8._40_8_ * (long)pCVar1 * 8 + *(long *)(CS + 0x458));
  local_d8._16_8_ = pCVar2;
  local_d8._24_8_ = (RhsNested)0x0;
  local_d8._32_8_ = pCVar1;
  pCVar1 = CS + 0x4a0;
  local_d8._0_8_ = uVar17;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)pCVar1,
             (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_e0,
             (assign_op<double,_double> *)&local_158);
  pCVar18 = local_40;
  local_e0 = (undefined1  [8])local_110;
  local_d8._0_8_ = local_40;
  local_d8._8_8_ = local_68;
  local_d8._16_8_ = local_110;
  local_d8._24_8_ = local_60;
  local_d8._32_8_ = local_110;
  local_d8._40_8_ = local_70;
  local_158.m_lhs.m_lhs.m_lhs = (LhsNested)0x0;
  local_158.m_lhs.m_lhs.m_rhs = (RhsNested)0x0;
  Eigen::internal::
  assignment_from_xpr_op_product<Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,0>,Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::Matrix<double,-1,1,0,-1,1>,0>const>,0>,0>,Eigen::internal::assign_op<double,double>,Eigen::internal::sub_assign_op<double,double>>
  ::
  run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>,0>,0>const>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_158,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_0>,_0>_>
              *)local_e0,(assign_op<double,_double> *)&local_88);
  pMVar9 = local_158.m_lhs.m_lhs.m_lhs;
  pCVar2 = CS + 600;
  pMVar11 = local_158.m_lhs.m_lhs.m_rhs;
  if (*(RhsNested *)(CS + 0x260) != local_158.m_lhs.m_lhs.m_rhs) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)pCVar2,
               (Index)local_158.m_lhs.m_lhs.m_rhs,1);
    pMVar11 = *(RhsNested *)(CS + 0x260);
  }
  lVar16 = *(long *)pCVar2;
  pMVar12 = (RhsNested)((long)pMVar11 - ((long)pMVar11 >> 0x3f) & 0xfffffffffffffffe);
  if (1 < (long)pMVar11) {
    lVar15 = 0;
    do {
      ppdVar3 = &(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_data + lVar15;
      IVar6 = (Index)ppdVar3[1];
      puVar10 = (undefined8 *)(lVar16 + lVar15 * 8);
      *puVar10 = *ppdVar3;
      puVar10[1] = IVar6;
      lVar15 = lVar15 + 2;
    } while (lVar15 < (long)pMVar12);
  }
  if ((long)pMVar12 < (long)pMVar11) {
    do {
      *(double **)(lVar16 + (long)pMVar12 * 8) =
           (&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data)[(long)pMVar12];
      pMVar12 = (RhsNested)
                ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                        m_storage.m_data + 1);
    } while (pMVar11 != pMVar12);
  }
  local_118 = pCVar2;
  free(local_158.m_lhs.m_lhs.m_lhs);
  local_158.m_lhs.m_lhs.m_lhs = (LhsNested)local_120;
  local_158.m_lhs.m_lhs.m_rhs = (RhsNested)pCVar18;
  pCVar2 = CS + 0x268;
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
            ((Matrix<double,_1,1,0,_1,1> *)local_e0,
             (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
              *)&local_158);
  auVar8 = local_e0;
  pCVar18 = (ConstraintSet *)local_d8._0_8_;
  if (*(ConstraintSet **)(CS + 0x270) != (ConstraintSet *)local_d8._0_8_) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)pCVar2,local_d8._0_8_,1);
    pCVar18 = *(ConstraintSet **)(CS + 0x270);
  }
  lVar16 = *(long *)pCVar2;
  pCVar13 = (ConstraintSet *)((long)pCVar18 - ((long)pCVar18 >> 0x3f) & 0xfffffffffffffffe);
  if (1 < (long)pCVar18) {
    lVar15 = 0;
    do {
      ppdVar3 = &(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)auVar8)->m_storage)
                 .m_data + lVar15;
      IVar6 = (Index)ppdVar3[1];
      puVar10 = (undefined8 *)(lVar16 + lVar15 * 8);
      *puVar10 = *ppdVar3;
      puVar10[1] = IVar6;
      lVar15 = lVar15 + 2;
    } while (lVar15 < (long)pCVar13);
  }
  if ((long)pCVar13 < (long)pCVar18) {
    do {
      *(double **)(lVar16 + (long)pCVar13 * 8) =
           (&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)auVar8)->m_storage).
             m_data)[(long)pCVar13];
      pCVar13 = pCVar13 + 1;
    } while (pCVar18 != pCVar13);
  }
  free((void *)local_e0);
  uVar17 = *(ulong *)(CS + 0x1f0);
  if (0 < (long)uVar17) {
    lVar16 = *(long *)(CS + 600);
    lVar15 = *(long *)(CS + 0x338);
    uVar19 = 0;
    do {
      *(undefined8 *)(lVar15 + uVar19 * 8) = *(undefined8 *)(lVar16 + uVar19 * 8);
      uVar19 = uVar19 + 1;
    } while ((uVar19 & 0xffffffff) < uVar17);
  }
  uVar19 = *(ulong *)(CS + 0x208);
  if (0 < (long)uVar19) {
    lVar16 = *(long *)(CS + 0x268);
    lVar15 = *(long *)(CS + 0x338);
    uVar20 = 0;
    do {
      *(undefined8 *)(lVar15 + (ulong)(uint)((int)uVar17 + (int)uVar20) * 8) =
           *(undefined8 *)(lVar16 + uVar20 * 8);
      uVar20 = uVar20 + 1;
    } while ((uVar20 & 0xffffffff) < uVar19);
  }
  local_158.m_lhs.m_lhs.m_lhs = (LhsNested)local_130;
  local_108 = pCVar2;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_e0,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)&local_158);
  pCVar2 = CS + 0x360;
  SolveLinearSystem((MatrixNd *)local_e0,(VectorNd *)(CS + 0x188),(VectorNd *)pCVar2,
                    *(LinearSolver *)CS);
  free((void *)local_e0);
  pCVar18 = local_100;
  local_80 = local_100;
  local_88 = pCVar1;
  local_78 = pCVar1;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_158,
             (DenseBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
              *)&local_88);
  local_d8._8_8_ = pCVar18;
  local_d8._24_8_ = local_128;
  local_f8.m_storage.m_data = (double *)0x0;
  local_f8.m_storage.m_rows = 0;
  local_e0 = (undefined1  [8])pCVar1;
  local_d8._32_8_ = pCVar2;
  local_d8._40_8_ = CS + 0x338;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_f8,*(Index *)(CS + 0x4b0),1);
  lVar16 = (((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_e0)->m_storage).
           m_cols;
  if (local_f8.m_storage.m_rows != lVar16) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_f8,lVar16,1);
    lVar16 = local_f8.m_storage.m_rows;
  }
  if (0 < lVar16) {
    memset(local_f8.m_storage.m_data,0,lVar16 << 3);
  }
  local_38 = 1.0;
  Eigen::internal::
  generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>,Eigen::Matrix<double,-1,1,0,-1,1>,0>const,Eigen::Matrix<double,-1,1,0,-1,1>const>,Eigen::DenseShape,Eigen::DenseShape,7>
  ::scaleAndAddTo<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_f8,
             (Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_e0,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)local_d8,&local_38);
  pCVar18 = CS + 0x370;
  SolveLinearSystem((MatrixNd *)&local_158,(VectorNd *)&local_f8,(VectorNd *)pCVar18,
                    *(LinearSolver *)CS);
  free(local_f8.m_storage.m_data);
  free(local_158.m_lhs.m_lhs.m_lhs);
  local_e0 = (undefined1  [8])local_128;
  local_d8._16_8_ = local_100;
  local_d8._24_8_ = local_128;
  local_a8.m_matrix = (non_const_type)local_100;
  local_158.m_lhs.m_lhs.m_lhs = (LhsNested)0x0;
  local_158.m_lhs.m_lhs.m_rhs = (RhsNested)0x0;
  local_d8._8_8_ = CS + 0x338;
  local_d8._32_8_ = pCVar2;
  local_a0 = pCVar1;
  local_98 = pCVar18;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_158,
             *(Index *)(CS + 0x498),1);
  pCVar13 = local_108;
  pMVar11 = (RhsNested)
            (((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_e0)->m_storage).
            m_cols;
  if (local_158.m_lhs.m_lhs.m_rhs != pMVar11) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_158,(Index)pMVar11
               ,1);
    pMVar11 = local_158.m_lhs.m_lhs.m_rhs;
  }
  if (0 < (long)pMVar11) {
    memset(local_158.m_lhs.m_lhs.m_lhs,0,(long)pMVar11 << 3);
  }
  local_88 = (ConstraintSet *)0x3ff0000000000000;
  Eigen::internal::
  generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>,Eigen::Matrix<double,-1,1,0,-1,1>,0>const>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>,Eigen::Matrix<double,-1,1,0,-1,1>,0>const>,Eigen::DenseShape,Eigen::DenseShape,7>
  ::scaleAndAddTo<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_158,
             (Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_e0,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)local_d8,(Scalar *)&local_88);
  SolveLinearSystem((MatrixNd *)local_130,(VectorNd *)&local_158,(VectorNd *)(CS + 0x130),
                    *(LinearSolver *)CS);
  free(local_158.m_lhs.m_lhs.m_lhs);
  local_e0 = (undefined1  [8])local_128;
  local_158.m_lhs.m_lhs.m_lhs = (LhsNested)0x0;
  local_158.m_lhs.m_lhs.m_rhs = (RhsNested)0x0;
  local_d8._0_8_ = pCVar2;
  local_d8._8_8_ = pCVar1;
  local_d8._16_8_ = pCVar18;
  Eigen::internal::
  assignment_from_xpr_op_product<Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,0>,Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,0>,Eigen::internal::assign_op<double,double>,Eigen::internal::add_assign_op<double,double>>
  ::
  run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_158,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)local_e0,(assign_op<double,_double> *)&local_88);
  pMVar12 = local_58;
  pCVar1 = local_118;
  pMVar9 = local_158.m_lhs.m_lhs.m_lhs;
  pMVar11 = local_158.m_lhs.m_lhs.m_rhs;
  if ((RhsNested)
      (local_58->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
      != local_158.m_lhs.m_lhs.m_rhs) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_58,
               (Index)local_158.m_lhs.m_lhs.m_rhs,1);
    pMVar11 = (RhsNested)
              (pMVar12->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_rows;
  }
  pdVar5 = (pMVar12->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_data;
  pMVar14 = (RhsNested)((long)pMVar11 - ((long)pMVar11 >> 0x3f) & 0xfffffffffffffffe);
  if (1 < (long)pMVar11) {
    lVar16 = 0;
    do {
      ppdVar3 = &(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_data + lVar16;
      dVar7 = (double)ppdVar3[1];
      pdVar4 = pdVar5 + lVar16;
      *pdVar4 = (double)*ppdVar3;
      pdVar4[1] = dVar7;
      lVar16 = lVar16 + 2;
    } while (lVar16 < (long)pMVar14);
  }
  if ((long)pMVar14 < (long)pMVar11) {
    do {
      pdVar5[(long)pMVar14] =
           (double)(&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_data)[(long)pMVar14];
      pMVar14 = (RhsNested)
                ((long)&(pMVar14->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                        m_storage.m_data + 1);
    } while (pMVar11 != pMVar14);
  }
  free(local_158.m_lhs.m_lhs.m_lhs);
  uVar17 = *(ulong *)(CS + 0x1f0);
  if (0 < (long)uVar17) {
    pdVar5 = (pMVar12->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data;
    lVar16 = *(long *)pCVar1;
    uVar19 = 0;
    do {
      *(double *)(lVar16 + uVar19 * 8) = pdVar5[uVar19];
      uVar19 = uVar19 + 1;
    } while ((uVar19 & 0xffffffff) < uVar17);
  }
  uVar19 = *(ulong *)(CS + 0x208);
  if (0 < (long)uVar19) {
    pdVar5 = (pMVar12->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data;
    lVar16 = *(long *)pCVar13;
    uVar20 = 0;
    do {
      *(double *)(lVar16 + uVar20 * 8) = pdVar5[(uint)((int)uVar17 + (int)uVar20)];
      uVar20 = uVar20 + 1;
    } while ((uVar20 & 0xffffffff) < uVar19);
  }
  local_e0 = (undefined1  [8])local_110;
  local_d8._0_8_ = pCVar1;
  local_d8._8_8_ = local_120;
  local_d8._16_8_ = pCVar13;
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>>
            ((Matrix<double,_1,1,0,_1,1> *)&local_158,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)local_e0);
  pMVar9 = local_158.m_lhs.m_lhs.m_lhs;
  pMVar11 = local_158.m_lhs.m_lhs.m_rhs;
  if ((RhsNested)
      (pMVar12->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
      != local_158.m_lhs.m_lhs.m_rhs) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)pMVar12,
               (Index)local_158.m_lhs.m_lhs.m_rhs,1);
    pMVar11 = (RhsNested)
              (pMVar12->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_rows;
  }
  pdVar5 = (pMVar12->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_data;
  pMVar14 = (RhsNested)((long)pMVar11 - ((long)pMVar11 >> 0x3f) & 0xfffffffffffffffe);
  if (1 < (long)pMVar11) {
    lVar16 = 0;
    do {
      ppdVar3 = &(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_data + lVar16;
      dVar7 = (double)ppdVar3[1];
      pdVar4 = pdVar5 + lVar16;
      *pdVar4 = (double)*ppdVar3;
      pdVar4[1] = dVar7;
      lVar16 = lVar16 + 2;
    } while (lVar16 < (long)pMVar14);
  }
  if ((long)pMVar14 < (long)pMVar11) {
    do {
      pdVar5[(long)pMVar14] =
           (double)(&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_data)[(long)pMVar14];
      pMVar14 = (RhsNested)
                ((long)&(pMVar14->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                        m_storage.m_data + 1);
    } while (pMVar11 != pMVar14);
  }
  free(local_158.m_lhs.m_lhs.m_lhs);
  local_e0 = (undefined1  [8])local_110;
  local_d8._0_8_ = local_68;
  local_d8._8_8_ = local_110;
  local_d8._24_8_ = local_60;
  local_d8._32_8_ = local_110;
  local_d8._40_8_ = local_70;
  local_a0 = (ConstraintSet *)pMVar12;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,0>,Eigen::internal::assign_op<double,double>>
            (TauOutput,
             (Product<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>
              *)local_e0,(assign_op<double,_double> *)&local_158,(type)0x0);
  return;
}

Assistant:

RBDL_DLLAPI
void InverseDynamicsConstraintsRelaxed(
  Model &model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDot,
  const Math::VectorNd &QDDotControls,
  ConstraintSet &CS,
  Math::VectorNd &QDDotOutput,
  Math::VectorNd &TauOutput,
  bool update_kinematics,
  std::vector<Math::SpatialVector> *f_ext)
{
  LOG << "-------- " << __func__ << " --------" << std::endl;

  //Check that the input vectors and matricies are sized appropriately
  assert(Q.size()               == model.q_size);
  assert(QDot.size()            == model.qdot_size);
  assert(QDDotControls.size()    == model.dof_count);
  assert(CS.S.cols()            == model.dof_count);
  assert(CS.W.rows()            == CS.W.cols());
  assert(CS.W.rows()            == CS.S.rows());
  assert(QDDotOutput.size()     == model.dof_count);

  TauOutput.setZero();
  CalcConstrainedSystemVariables(model,Q,QDot,TauOutput,CS,update_kinematics,
                                f_ext);

  unsigned int n  = unsigned(    CS.H.rows());
  unsigned int nc = unsigned( CS.name.size());
  unsigned int na = unsigned(    CS.S.rows());
  unsigned int nu = n-na;

  //MM 2020/5/29:
  //  The updates I made to Henning's original formulation have
  //  almost certainly made the sensitivity of the resulting qdd
  //  w.r.t. the controls poorly scaled. At least this is a suspicion
  //  of mine looking at how an OCP is behaving when using this operator.
  //  Reverting to the original formulation.
  //MM: Update to Henning's formulation s.t. the relaxed IDC operator will
  //    more closely satisfy QDDotControls if it is possible.
  //double diag = 0.;//100.*CS.H.maxCoeff();
  //double diagInv = 0.;
  //for(unsigned int i=0; i<CS.H.rows(); ++i) {
  //  for(unsigned int j=0; j<CS.H.cols(); ++j) {
  //    if(fabs(CS.H(i,j)) > diag) {
  //      diag = fabs(CS.H(i,j));
  //    }
  //  }
  //}
  //diag = diag*100.;
  //diagInv = 1.0/diag;
  //for(unsigned int i=0; i<CS.W.rows(); ++i) {
  //  CS.W(i,i)    = diag;
  //  CS.Winv(i,i) = diagInv;
  //}

  CS.W = 100.0*CS.S*CS.H*CS.S.transpose();
  CS.Winv = CS.W.inverse();
  CS.WinvSC = CS.Winv * CS.S * CS.C;

  //CS.W = CS.S*CS.H*CS.S.transpose();

  CS.F.block(  0,  0, na, na) = CS.S*CS.H*CS.S.transpose() + CS.W;
  CS.F.block(  0, na, na, nu) = CS.S*CS.H*CS.P.transpose();
  CS.F.block( na,  0, nu, na) = CS.P*CS.H*CS.S.transpose();
  CS.F.block( na, na, nu, nu) = CS.P*CS.H*CS.P.transpose();

  CS.GT.block(  0, 0,na, nc) = CS.S*(CS.G.transpose());
  CS.GT.block( na, 0,nu, nc) = CS.P*(CS.G.transpose());

  CS.GT_qr.compute (CS.GT);
  CS.GT_qr.householderQ().evalTo (CS.GT_qr_Q);

  //GT = [Y  Z] * [ R ]
  //              [ 0 ]

  CS.R  = CS.GT_qr_Q.transpose()*CS.GT;
  CS.Ru = CS.R.block(0,0,nc,nc);

  CS.Y = CS.GT_qr_Q.block( 0, 0,  n, nc    );
  CS.Z = CS.GT_qr_Q.block( 0, nc, n, (n-nc));

  //MM: Update to Henning's formulation s.t. the relaxed IDC operator will
  //    exactly satisfy QDDotControls if it is possible.
  //
  //Modify QDDotControls so that SN is cancelled.
  //
  //    +SC - WS(qdd*)
  //
  // Add a term to cancel off SN
  //
  //    +SC - WS( qdd* + (S' W^-1 S)N )
  //

  CS.u = CS.S*CS.C - CS.W*(CS.S*(QDDotControls
                                 +(CS.S.transpose()*CS.WinvSC)));
  //CS.u =  CS.S*CS.C - CS.W*(CS.S*QDDotControls);
  CS.v =  CS.P*CS.C;

  for(unsigned int i=0; i<CS.S.rows(); ++i) {
    CS.g[i] = CS.u[i];
  }
  unsigned int j=CS.S.rows();
  for(unsigned int i=0; i<CS.P.rows(); ++i) {
    CS.g[j] = CS.v[i];
    ++j;
  }

  //nc x nc system
  SolveLinearSystem(CS.Ru.transpose(), CS.gamma, CS.py, CS.linear_solver);

  //(n-nc) x (n-nc) system
  SolveLinearSystem(CS.Z.transpose()*CS.F*CS.Z,
                    CS.Z.transpose()*(-CS.F*CS.Y*CS.py-CS.g),
                    CS.pz,
                    CS.linear_solver);

  //nc x nc system
  SolveLinearSystem(CS.Ru,
                    CS.Y.transpose()*(CS.g + CS.F*CS.Y*CS.py + CS.F*CS.Z*CS.pz),
                    CS.force, CS.linear_solver);

  //Eqn. 32d, the equation for qdd, is in error. Instead
  // p = Ypy + Zpz = [v,w]
  // qdd = S'v + P'w
  QDDotOutput = CS.Y*CS.py + CS.Z*CS.pz;
  for(unsigned int i=0; i<CS.S.rows(); ++i) {
    CS.u[i] = QDDotOutput[i];
  }
  j = CS.S.rows();
  for(unsigned int i=0; i<CS.P.rows(); ++i) {
    CS.v[i] = QDDotOutput[j];
    ++j;
  }

  QDDotOutput = CS.S.transpose()*CS.u
                +CS.P.transpose()*CS.v;

  TauOutput = (CS.S.transpose()*CS.W*CS.S)*(
                QDDotControls+(CS.S.transpose()*CS.WinvSC)
                -QDDotOutput);
  //TauOutput =  CS.S.transpose()*CS.W*CS.S*(QDDotControls - QDDotOutput);


}